

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

void __thiscall SkipList::SkipList(SkipList *this)

{
  bool bVar1;
  int iVar2;
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *this_00;
  reference ppEVar3;
  Element **i;
  iterator __end1;
  iterator __begin1;
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *__range1;
  SkipList *this_local;
  
  this->MAX_HEIGHT = 0x10;
  iVar2 = std::numeric_limits<int>::max();
  this->INF = iVar2;
  Element::Element(&this->head,0,this->MAX_HEIGHT);
  Element::Element(&this->tail,this->INF,0);
  this->height = 0;
  this_00 = &(this->head).next;
  __end1 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::begin(this_00);
  i = (Element **)
      std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SkipList::Element_**,_std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<SkipList::Element_**,_std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>_>
              ::operator*(&__end1);
    *ppEVar3 = &this->tail;
    __gnu_cxx::
    __normal_iterator<SkipList::Element_**,_std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

SkipList::SkipList() : head(0, MAX_HEIGHT), tail(INF, 0), height(0) {
    for (auto &i : head.next) {
        i = &tail;
    }
}